

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImTextureID_resizeT(ImVector_ImTextureID *self,int new_size,ImTextureID v)

{
  ImTextureID local_8;
  
  local_8 = v;
  ImVector<void_*>::resize(self,new_size,&local_8);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImTextureID_resizeT(ImVector_ImTextureID* self,int new_size,const ImTextureID v)
{
    return self->resize(new_size,v);
}